

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O0

void print_jit_status(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_State *in_RDI;
  char *pcVar3;
  char *s;
  int n;
  char *in_stack_00000020;
  int in_stack_0000002c;
  lua_State *in_stack_00000030;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  lua_getfield(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  lua_getfield(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  lua_remove(in_RDI,in_stack_fffffffffffffff4);
  lua_getfield(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  lua_remove(in_RDI,in_stack_fffffffffffffff4);
  iVar1 = lua_gettop(in_RDI);
  lua_call((lua_State *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
           (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),(int)in_stack_ffffffffffffffe8);
  iVar2 = lua_toboolean((lua_State *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
                        (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  pcVar3 = "JIT: OFF";
  if (iVar2 != 0) {
    pcVar3 = "JIT: ON";
  }
  fputs(pcVar3,_stdout);
  while( true ) {
    iVar1 = iVar1 + 1;
    pcVar3 = lua_tolstring((lua_State *)s,(int)((ulong)in_RDI >> 0x20),
                           (size_t *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    if (pcVar3 == (char *)0x0) break;
    putc(0x20,_stdout);
    fputs(pcVar3,_stdout);
  }
  putc(10,_stdout);
  return;
}

Assistant:

static void print_jit_status(lua_State *L)
{
  int n;
  const char *s;
  lua_getfield(L, LUA_REGISTRYINDEX, "_LOADED");
  lua_getfield(L, -1, "jit");  /* Get jit.* module table. */
  lua_remove(L, -2);
  lua_getfield(L, -1, "status");
  lua_remove(L, -2);
  n = lua_gettop(L);
  lua_call(L, 0, LUA_MULTRET);
  fputs(lua_toboolean(L, n) ? "JIT: ON" : "JIT: OFF", stdout);
  for (n++; (s = lua_tostring(L, n)); n++) {
    putc(' ', stdout);
    fputs(s, stdout);
  }
  putc('\n', stdout);
}